

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo6.cpp
# Opt level: O1

void no_intrin(state *s)

{
  uint uVar1;
  int iVar2;
  uint *elem;
  rep rVar3;
  pointer puVar4;
  long lVar5;
  scope scope;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  srand(s->_iterations);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_38,(long)s->_iterations);
  if (0 < s->_iterations) {
    iVar6 = 0;
    do {
      iVar2 = rand();
      local_3c = iVar2 + 1;
      if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_38,
                   (iterator)
                   local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_3c);
      }
      else {
        *local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_3c;
        local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < s->_iterations);
  }
  rVar3 = std::chrono::_V2::system_clock::now();
  (s->_start).__d.__r = rVar3;
  uVar8 = 0;
  puVar4 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      uVar7 = *puVar4;
      uVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar6 = (uVar1 ^ 0xffffffe0) + 0x21;
      if (uVar7 == 0) {
        iVar6 = 0;
      }
      uVar7 = (int)uVar8 + iVar6;
      uVar8 = (ulong)uVar7;
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    uVar8 = (ulong)(int)uVar7;
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  s->_duration_ns = lVar5 - (s->_start).__d.__r;
  s->_result = uVar8;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void no_intrin(picobench::state& s)
{
    std::vector<uint32_t> v;
    srand(s.iterations());
    v.reserve(s.iterations());

    for (int i = 0; i<s.iterations(); ++i) {
        int n = rand() + 1;
        v.push_back(n);
    }

    int sum = 0;

    {
        picobench::scope scope(s);
        for (const auto& elem : v) {
            sum += lame_count_bits(elem);
        }
    }

    s.set_result(sum);
}